

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

char * __thiscall sqvector<char>::push_back(sqvector<char> *this,char *val)

{
  char *p;
  ulong uVar1;
  SQUnsignedInteger size;
  
  p = this->_vals;
  uVar1 = this->_size;
  if (this->_allocated <= uVar1) {
    size = 4;
    if (uVar1 * 2 != 0) {
      size = uVar1 * 2;
    }
    p = (char *)sq_vm_realloc(p,this->_allocated,size);
    this->_vals = p;
    this->_allocated = size;
    uVar1 = this->_size;
  }
  this->_size = uVar1 + 1;
  p[uVar1] = *val;
  return p + uVar1;
}

Assistant:

inline T &push_back(const T& val = T())
    {
        if(_allocated <= _size)
            _realloc(_size * 2);
        return *(new ((void *)&_vals[_size++]) T(val));
    }